

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

bool __thiscall ClipperLib::Clipper::ExecuteInternal(Clipper *this,bool fixHoleLinkages)

{
  bool bVar1;
  pointer ppOVar2;
  OutRec *outRec;
  bool bVar3;
  bool bVar4;
  long64 botY;
  long64 topY;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 UseFullInt64Range;
  size_type i;
  ulong uVar5;
  double dVar6;
  
  (*this->_vptr_Clipper[3])();
  if (*(long *)(this->_vptr_Clipper[-3] +
               (long)&(this->m_PolyOuts).
                      super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
               ) == 0) {
    bVar3 = true;
  }
  else {
    botY = PopScanbeam(this);
    do {
      InsertLocalMinimaIntoAEL(this,botY);
      ClearHorzJoins(this);
      ProcessHorizontals(this);
      topY = PopScanbeam(this);
      bVar3 = ProcessIntersections(this,botY,topY);
      if (!bVar3) {
        bVar3 = false;
        goto LAB_005854c0;
      }
      ProcessEdgesAtTopOfScanbeam(this,topY);
      botY = topY;
    } while (this->m_Scanbeam != (Scanbeam *)0x0);
    for (uVar5 = 0;
        ppOVar2 = (this->m_PolyOuts).
                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        uVar5 < (ulong)((long)(this->m_PolyOuts).
                              super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar2 >> 3);
        uVar5 = uVar5 + 1) {
      outRec = ppOVar2[uVar5];
      if (outRec->pts != (OutPt *)0x0) {
        FixupOutPolygon(this,outRec);
        if (outRec->pts != (OutPt *)0x0) {
          UseFullInt64Range = extraout_DL;
          if ((outRec->isHole & fixHoleLinkages) == 1) {
            FixHoleLinkage(this,outRec);
            UseFullInt64Range = extraout_DL_00;
          }
          if (outRec->bottomPt == outRec->bottomFlag) {
            bVar3 = Orientation((ClipperLib *)outRec,
                                (OutRec *)
                                (ulong)(byte)(this->_vptr_Clipper[-3] + 0x10)
                                             [(long)&(this->m_PolyOuts).
                                                                                                          
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                             ],(bool)UseFullInt64Range);
            dVar6 = Area(outRec,(bool)(this->_vptr_Clipper[-3] + 0x10)
                                      [(long)&(this->m_PolyOuts).
                                              super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                      ]);
            UseFullInt64Range = extraout_DL_01;
            if (dVar6 <= 0.0 == bVar3) {
              DisposeBottomPt(this,outRec);
              UseFullInt64Range = extraout_DL_02;
            }
          }
          bVar3 = outRec->isHole;
          bVar1 = this->m_ReverseOutput;
          bVar4 = Orientation((ClipperLib *)outRec,
                              (OutRec *)
                              (ulong)(byte)(this->_vptr_Clipper[-3] + 0x10)
                                           [(long)&(this->m_PolyOuts).
                                                                                                      
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                           ],(bool)UseFullInt64Range);
          if (bVar3 == (bool)(bVar4 ^ bVar1)) {
            ReversePolyPtLinks(outRec->pts);
          }
        }
      }
    }
    JoinCommonEdges(this,fixHoleLinkages);
    bVar3 = true;
    if (fixHoleLinkages) {
      std::
      __sort<__gnu_cxx::__normal_iterator<ClipperLib::OutRec**,std::vector<ClipperLib::OutRec*,std::allocator<ClipperLib::OutRec*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(ClipperLib::OutRec*,ClipperLib::OutRec*)>>
                ((__normal_iterator<ClipperLib::OutRec_**,_std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>_>
                  )(this->m_PolyOuts).
                   super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<ClipperLib::OutRec_**,_std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>_>
                  )(this->m_PolyOuts).
                   super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                 (_Iter_comp_iter<bool_(*)(ClipperLib::OutRec_*,_ClipperLib::OutRec_*)>)0x5851ed);
    }
LAB_005854c0:
    ClearJoins(this);
    ClearHorzJoins(this);
  }
  return bVar3;
}

Assistant:

bool Clipper::ExecuteInternal(bool fixHoleLinkages)
{
  bool succeeded;
  try {
    Reset();
    if (!m_CurrentLM ) return true;
    long64 botY = PopScanbeam();
    do {
      InsertLocalMinimaIntoAEL(botY);
      ClearHorzJoins();
      ProcessHorizontals();
      long64 topY = PopScanbeam();
      succeeded = ProcessIntersections(botY, topY);
      if (!succeeded) break;
      ProcessEdgesAtTopOfScanbeam(topY);
      botY = topY;
    } while( m_Scanbeam );
  }
  catch(...) {
    succeeded = false;
  }

  if (succeeded)
  {
    //tidy up output polygons and fix orientations where necessary ...
    for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
    {
      OutRec *outRec = m_PolyOuts[i];
      if (!outRec->pts) continue;
      FixupOutPolygon(*outRec);
      if (!outRec->pts) continue;
      if (outRec->isHole && fixHoleLinkages) FixHoleLinkage(outRec);

      if (outRec->bottomPt == outRec->bottomFlag &&
        (Orientation(outRec, m_UseFullRange) != (Area(*outRec, m_UseFullRange) > 0)))
          DisposeBottomPt(*outRec);

      if (outRec->isHole ==
        (m_ReverseOutput ^ Orientation(outRec, m_UseFullRange)))
          ReversePolyPtLinks(*outRec->pts);
    }

    JoinCommonEdges(fixHoleLinkages);
    if (fixHoleLinkages)
      std::sort(m_PolyOuts.begin(), m_PolyOuts.end(), PolySort);
  }

  ClearJoins();
  ClearHorzJoins();
  return succeeded;
}